

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O3

void Test_Strerror_logging::RunTest(void)

{
  undefined4 uVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *buf;
  string *psVar5;
  ostream *poVar6;
  int err;
  char *msg;
  CheckOpString local_50;
  string local_48;
  char *local_28;
  
  pcVar3 = strerror(4);
  pcVar3 = strdup(pcVar3);
  local_28 = pcVar3;
  sVar4 = strlen(pcVar3);
  sVar4 = sVar4 + 1;
  if (google::g_new_hook != (code *)0x0) {
    (*google::g_new_hook)();
  }
  buf = (char *)malloc(sVar4);
  local_48._M_dataplus._M_p._0_4_ = google::posix_strerror_r(4,(char *)0x0,0);
  local_50.str_._0_4_ = 0xffffffff;
  uVar1 = local_50.str_._0_4_;
  local_50.str_._0_4_ = 0xffffffff;
  if ((int)local_48._M_dataplus._M_p != -1) {
    local_50.str_._0_4_ = uVar1;
    psVar5 = google::MakeCheckOpString<int,int>
                       ((int *)&local_48,(int *)&local_50,
                        "posix_strerror_r(errcode, __null, 0) == -1");
    if (psVar5 != (string *)0x0) {
      local_50.str_ = psVar5;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x421,&local_50);
      google::LogMessage::stream((LogMessage *)&local_48);
      goto LAB_00118bb0;
    }
  }
  *buf = 'A';
  local_48._M_dataplus._M_p._0_4_ = google::posix_strerror_r(4,buf,0);
  local_50.str_._0_4_ = 0xffffffff;
  if ((int)local_48._M_dataplus._M_p != -1) {
    psVar5 = google::MakeCheckOpString<int,int>
                       ((int *)&local_48,(int *)&local_50,"posix_strerror_r(errcode, buf, 0) == -1")
    ;
    if (psVar5 != (string *)0x0) {
      local_50.str_ = psVar5;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x423,&local_50);
      google::LogMessage::stream((LogMessage *)&local_48);
      goto LAB_00118bb0;
    }
  }
  local_48._M_dataplus._M_p._0_4_ = CONCAT31(local_48._M_dataplus._M_p._1_3_,*buf);
  local_50.str_._0_1_ = 0x41;
  if (*buf != 'A') {
    psVar5 = google::MakeCheckOpString<char,char>
                       ((char *)&local_48,(char *)&local_50,"buf[0] == \'A\'");
    if (psVar5 != (string *)0x0) {
      local_50.str_ = psVar5;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x424,&local_50);
      google::LogMessage::stream((LogMessage *)&local_48);
      goto LAB_00118bb0;
    }
  }
  local_48._M_dataplus._M_p._0_4_ = google::posix_strerror_r(4,(char *)0x0,sVar4);
  local_50.str_._0_4_ = 0xffffffff;
  if ((int)local_48._M_dataplus._M_p != -1) {
    psVar5 = google::MakeCheckOpString<int,int>
                       ((int *)&local_48,(int *)&local_50,
                        "posix_strerror_r(errcode, __null, buf_size) == -1");
    if (psVar5 != (string *)0x0) {
      local_50.str_ = psVar5;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x425,&local_50);
      google::LogMessage::stream((LogMessage *)&local_48);
      goto LAB_00118bb0;
    }
  }
  local_48._M_dataplus._M_p._0_4_ = google::posix_strerror_r(4,buf,1);
  local_50.str_ = (string *)((ulong)local_50.str_._4_4_ << 0x20);
  if ((int)local_48._M_dataplus._M_p != 0) {
    psVar5 = google::MakeCheckOpString<int,int>
                       ((int *)&local_48,(int *)&local_50,"posix_strerror_r(errcode, buf, 1) == 0");
    if (psVar5 != (string *)0x0) {
      local_50.str_ = psVar5;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x42b,&local_50);
      google::LogMessage::stream((LogMessage *)&local_48);
      goto LAB_00118bb0;
    }
  }
  psVar5 = google::CheckstrcmptrueImpl_abi_cxx11_(buf,"","buf == \"\"");
  if (psVar5 == (string *)0x0) {
    local_48._M_dataplus._M_p._0_4_ = google::posix_strerror_r(4,buf,sVar4);
    local_50.str_ = local_50.str_ & 0xffffffff00000000;
    if ((int)local_48._M_dataplus._M_p != 0) {
      psVar5 = google::MakeCheckOpString<int,int>
                         ((int *)&local_48,(int *)&local_50,
                          "posix_strerror_r(errcode, buf, buf_size) == 0");
      if (psVar5 != (string *)0x0) {
        local_50.str_ = psVar5;
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_48,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                   ,0x42e,&local_50);
        google::LogMessage::stream((LogMessage *)&local_48);
        goto LAB_00118bb0;
      }
    }
    psVar5 = google::CheckstrcmptrueImpl_abi_cxx11_(buf,pcVar3,"buf == msg");
    if (psVar5 == (string *)0x0) {
      free(buf);
      google::StrError_abi_cxx11_(&local_48,(google *)0x4,err);
      iVar2 = std::__cxx11::string::compare((char *)&local_48);
      if (iVar2 == 0) {
        psVar5 = (string *)0x0;
      }
      else {
        psVar5 = google::MakeCheckOpString<char*,std::__cxx11::string>
                           (&local_28,&local_48,"msg == StrError(errcode)");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_48._M_dataplus._M_p._4_4_,(int)local_48._M_dataplus._M_p) !=
          &local_48.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_48._M_dataplus._M_p._4_4_,(int)local_48._M_dataplus._M_p),
                        local_48.field_2._M_allocated_capacity + 1);
      }
      if (psVar5 == (string *)0x0) {
        free(local_28);
        return;
      }
      local_50.str_ = psVar5;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x431,&local_50);
      google::LogMessage::stream((LogMessage *)&local_48);
    }
    else {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x42f);
      poVar6 = google::LogMessage::stream((LogMessage *)&local_48);
      std::operator<<(poVar6,(string *)psVar5);
    }
  }
  else {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x42d);
    poVar6 = google::LogMessage::stream((LogMessage *)&local_48);
    std::operator<<(poVar6,(string *)psVar5);
  }
LAB_00118bb0:
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_48);
}

Assistant:

TEST(Strerror, logging) {
  int errcode = EINTR;
  char *msg = strdup(strerror(errcode));
  const size_t buf_size = strlen(msg) + 1;
  char *buf = new char[buf_size];
  CHECK_EQ(posix_strerror_r(errcode, NULL, 0), -1);
  buf[0] = 'A';
  CHECK_EQ(posix_strerror_r(errcode, buf, 0), -1);
  CHECK_EQ(buf[0], 'A');
  CHECK_EQ(posix_strerror_r(errcode, NULL, buf_size), -1);
#if defined(OS_MACOSX) || defined(OS_FREEBSD) || defined(OS_OPENBSD)
  // MacOSX or FreeBSD considers this case is an error since there is
  // no enough space.
  CHECK_EQ(posix_strerror_r(errcode, buf, 1), -1);
#else
  CHECK_EQ(posix_strerror_r(errcode, buf, 1), 0);
#endif
  CHECK_STREQ(buf, "");
  CHECK_EQ(posix_strerror_r(errcode, buf, buf_size), 0);
  CHECK_STREQ(buf, msg);
  delete[] buf;
  CHECK_EQ(msg, StrError(errcode));
  free(msg);
}